

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_rules.hpp
# Opt level: O1

void ovf::detail::parse::v2::ovf_segment_header_action<ovf::detail::parse::v2::keyword_value_line>::
     apply<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
               (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *in,ovf_file *f,ovf_segment *segment)

{
  uint uVar1;
  parser_state *ppVar2;
  pointer pcVar3;
  size_type sVar4;
  int iVar5;
  char **ppcVar6;
  char *pcVar7;
  parse_error *ppVar8;
  char **in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  _Alloc_hider _Var9;
  size_t sVar10;
  bool bVar11;
  float fVar12;
  string meshtype;
  allocator local_79;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  allocator local_31;
  
  iVar5 = std::__cxx11::string::compare((char *)&f->_state->keyword);
  ppVar2 = f->_state;
  if (iVar5 == 0) {
    pcVar7 = strdup((ppVar2->value)._M_dataplus._M_p);
    segment->title = pcVar7;
    ppVar2->found_title = true;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&ppVar2->keyword);
    if (iVar5 == 0) {
      pcVar7 = strdup((f->_state->value)._M_dataplus._M_p);
      segment->comment = pcVar7;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&f->_state->keyword);
      ppVar2 = f->_state;
      if (iVar5 == 0) {
        pcVar7 = strdup((ppVar2->value)._M_dataplus._M_p);
        segment->meshunit = pcVar7;
        ppVar2->found_meshunit = true;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&ppVar2->keyword);
        if (iVar5 == 0) {
          std::__cxx11::string::string
                    ((string *)&local_78,(f->_state->value)._M_dataplus._M_p,&local_79);
          _Var9._M_p = local_78._M_dataplus._M_p;
          in = (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)__errno_location();
          iVar5 = *(int *)&(in->m_begin).data;
          *(int *)&(in->m_begin).data = 0;
          ppcVar6 = (char **)strtol(_Var9._M_p,(char **)&local_58._M_allocated_capacity,10);
          if ((pointer)local_58._M_allocated_capacity == _Var9._M_p) {
            std::__throw_invalid_argument("stoi");
          }
          else {
            in_RCX = (char **)(long)(int)ppcVar6;
            if (in_RCX == ppcVar6) {
              uVar1 = *(uint *)&(in->m_begin).data;
              in_RCX = (char **)(ulong)uVar1;
              if (uVar1 != 0x22) {
                if (uVar1 == 0) {
                  *(int *)&(in->m_begin).data = iVar5;
                }
                segment->valuedim = (int)ppcVar6;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != &local_78.field_2) {
                  operator_delete(local_78._M_dataplus._M_p);
                }
                f->_state->found_valuedim = true;
                goto LAB_0014b9c5;
              }
            }
          }
          std::__throw_out_of_range("stoi");
LAB_0014bdc3:
          ppVar8 = (parse_error *)__cxa_allocate_exception(0x28);
          fmt::v5::format<char[56],char*>
                    (&local_78,(v5 *)"xbase is only for rectangular meshes! Mesh type is \"{}\"",
                     (char (*) [56])_Var9._M_p,in_RCX);
          tao::pegtl::parse_error::
          parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                    (ppVar8,&local_78,in);
          __cxa_throw(ppVar8,&tao::pegtl::parse_error::typeinfo,
                      tao::pegtl::parse_error::~parse_error);
        }
        iVar5 = std::__cxx11::string::compare((char *)&f->_state->keyword);
        ppVar2 = f->_state;
        if (iVar5 == 0) {
          pcVar7 = strdup((ppVar2->value)._M_dataplus._M_p);
          segment->valueunits = pcVar7;
          ppVar2->found_valueunits = true;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&ppVar2->keyword);
          ppVar2 = f->_state;
          if (iVar5 == 0) {
            pcVar7 = strdup((ppVar2->value)._M_dataplus._M_p);
            segment->valuelabels = pcVar7;
            ppVar2->found_valuelabels = true;
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)&ppVar2->keyword);
            if (iVar5 == 0) {
              std::__cxx11::string::string
                        ((string *)&local_78,(f->_state->value)._M_dataplus._M_p,
                         (allocator *)local_58._M_local_buf);
              fVar12 = std::__cxx11::stof(&local_78,(size_t *)0x0);
              segment->bounds_min[0] = fVar12;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p);
              }
              f->_state->found_xmin = true;
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)&f->_state->keyword);
              if (iVar5 == 0) {
                std::__cxx11::string::string
                          ((string *)&local_78,(f->_state->value)._M_dataplus._M_p,
                           (allocator *)local_58._M_local_buf);
                fVar12 = std::__cxx11::stof(&local_78,(size_t *)0x0);
                segment->bounds_min[1] = fVar12;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != &local_78.field_2) {
                  operator_delete(local_78._M_dataplus._M_p);
                }
                f->_state->found_ymin = true;
              }
              else {
                iVar5 = std::__cxx11::string::compare((char *)&f->_state->keyword);
                if (iVar5 == 0) {
                  std::__cxx11::string::string
                            ((string *)&local_78,(f->_state->value)._M_dataplus._M_p,
                             (allocator *)local_58._M_local_buf);
                  fVar12 = std::__cxx11::stof(&local_78,(size_t *)0x0);
                  segment->bounds_min[2] = fVar12;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_78._M_dataplus._M_p != &local_78.field_2) {
                    operator_delete(local_78._M_dataplus._M_p);
                  }
                  f->_state->found_zmin = true;
                }
                else {
                  iVar5 = std::__cxx11::string::compare((char *)&f->_state->keyword);
                  if (iVar5 == 0) {
                    std::__cxx11::string::string
                              ((string *)&local_78,(f->_state->value)._M_dataplus._M_p,
                               (allocator *)local_58._M_local_buf);
                    fVar12 = std::__cxx11::stof(&local_78,(size_t *)0x0);
                    segment->bounds_max[0] = fVar12;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_78._M_dataplus._M_p != &local_78.field_2) {
                      operator_delete(local_78._M_dataplus._M_p);
                    }
                    f->_state->found_xmax = true;
                  }
                  else {
                    iVar5 = std::__cxx11::string::compare((char *)&f->_state->keyword);
                    if (iVar5 == 0) {
                      std::__cxx11::string::string
                                ((string *)&local_78,(f->_state->value)._M_dataplus._M_p,
                                 (allocator *)local_58._M_local_buf);
                      fVar12 = std::__cxx11::stof(&local_78,(size_t *)0x0);
                      segment->bounds_max[1] = fVar12;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_78._M_dataplus._M_p != &local_78.field_2) {
                        operator_delete(local_78._M_dataplus._M_p);
                      }
                      f->_state->found_ymax = true;
                    }
                    else {
                      iVar5 = std::__cxx11::string::compare((char *)&f->_state->keyword);
                      if (iVar5 == 0) {
                        std::__cxx11::string::string
                                  ((string *)&local_78,(f->_state->value)._M_dataplus._M_p,
                                   (allocator *)local_58._M_local_buf);
                        fVar12 = std::__cxx11::stof(&local_78,(size_t *)0x0);
                        segment->bounds_max[2] = fVar12;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_78._M_dataplus._M_p != &local_78.field_2) {
                          operator_delete(local_78._M_dataplus._M_p);
                        }
                        f->_state->found_zmax = true;
                      }
                      else {
                        iVar5 = std::__cxx11::string::compare((char *)&f->_state->keyword);
                        if (iVar5 == 0) {
                          args = &local_78.field_2;
                          pcVar3 = (f->_state->value)._M_dataplus._M_p;
                          local_78._M_dataplus._M_p = (pointer)args;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_78,pcVar3,
                                     pcVar3 + (f->_state->value)._M_string_length);
                          sVar4 = local_78._M_string_length;
                          _Var9._M_p = local_78._M_dataplus._M_p;
                          if (local_78._M_string_length != 0) {
                            sVar10 = 0;
                            do {
                              iVar5 = tolower((int)_Var9._M_p[sVar10]);
                              _Var9._M_p[sVar10] = (char)iVar5;
                              sVar10 = sVar10 + 1;
                            } while (sVar4 != sVar10);
                          }
                          std::__cxx11::string::string
                                    ((string *)local_58._M_local_buf,segment->meshtype,&local_79);
                          iVar5 = std::__cxx11::string::compare(local_58._M_local_buf);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_58._M_allocated_capacity != &local_48) {
                            operator_delete((void *)local_58._M_allocated_capacity);
                          }
                          ppcVar6 = &segment->meshtype;
                          if (iVar5 == 0) {
                            iVar5 = std::__cxx11::string::compare((char *)&local_78);
                            if ((iVar5 != 0) &&
                               (iVar5 = std::__cxx11::string::compare((char *)&local_78), iVar5 != 0
                               )) {
                              ppVar8 = (parse_error *)__cxa_allocate_exception(0x28);
                              fmt::v5::format<char[23],std::__cxx11::string>
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&local_58,(v5 *)"Invalid meshtype: \"{}\"",
                                         (char (*) [23])&local_78,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)args);
                              tao::pegtl::parse_error::
                              parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                        (ppVar8,(string *)&local_58,in);
                              __cxa_throw(ppVar8,&tao::pegtl::parse_error::typeinfo,
                                          tao::pegtl::parse_error::~parse_error);
                            }
                            pcVar7 = strdup(local_78._M_dataplus._M_p);
                            *ppcVar6 = pcVar7;
                          }
                          else {
                            std::__cxx11::string::string
                                      ((string *)local_58._M_local_buf,*ppcVar6,&local_79);
                            bVar11 = true;
                            if (local_58._8_8_ == local_78._M_string_length) {
                              if (local_58._8_8_ == 0) {
                                bVar11 = false;
                              }
                              else {
                                iVar5 = bcmp((void *)local_58._M_allocated_capacity,
                                             local_78._M_dataplus._M_p,local_58._8_8_);
                                bVar11 = iVar5 != 0;
                              }
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_58._M_allocated_capacity != &local_48) {
                              operator_delete((void *)local_58._M_allocated_capacity);
                            }
                            if (bVar11) {
                              ppVar8 = (parse_error *)__cxa_allocate_exception(0x28);
                              fmt::v5::format<char[94],std::__cxx11::string,char*>
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&local_58,
                                         (v5 *)
                                         "meshtype \"{}\" was specified, but due to other parameters specified before, \"{}\" was expected!"
                                         ,(char (*) [94])&local_78,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)ppcVar6,(char **)in_R8);
                              tao::pegtl::parse_error::
                              parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                        (ppVar8,(string *)&local_58,in);
                              __cxa_throw(ppVar8,&tao::pegtl::parse_error::typeinfo,
                                          tao::pegtl::parse_error::~parse_error);
                            }
                          }
                          f->_state->found_meshtype = true;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_78._M_dataplus._M_p != &local_78.field_2) {
                            operator_delete(local_78._M_dataplus._M_p);
                          }
                        }
                        else {
                          iVar5 = std::__cxx11::string::compare((char *)&f->_state->keyword);
                          if (iVar5 == 0) {
                            std::__cxx11::string::string
                                      ((string *)&local_78,segment->meshtype,
                                       (allocator *)local_58._M_local_buf);
                            iVar5 = std::__cxx11::string::compare((char *)&local_78);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
                              operator_delete(local_78._M_dataplus._M_p);
                            }
                            _Var9._M_p = (pointer)&segment->meshtype;
                            if (iVar5 != 0) goto LAB_0014bdc3;
                            pcVar7 = strdup("rectangular");
                            *(char **)_Var9._M_p = pcVar7;
                            std::__cxx11::string::string
                                      ((string *)&local_78,(f->_state->value)._M_dataplus._M_p,
                                       (allocator *)local_58._M_local_buf);
                            fVar12 = std::__cxx11::stof(&local_78,(size_t *)0x0);
                            segment->origin[0] = fVar12;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
                              operator_delete(local_78._M_dataplus._M_p);
                            }
                            f->_state->found_xbase = true;
                          }
                          else {
                            iVar5 = std::__cxx11::string::compare((char *)&f->_state->keyword);
                            if (iVar5 == 0) {
                              std::__cxx11::string::string
                                        ((string *)&local_78,segment->meshtype,
                                         (allocator *)local_58._M_local_buf);
                              iVar5 = std::__cxx11::string::compare((char *)&local_78);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                                operator_delete(local_78._M_dataplus._M_p);
                              }
                              if (iVar5 != 0) {
                                ppVar8 = (parse_error *)__cxa_allocate_exception(0x28);
                                fmt::v5::format<char[56],char*>
                                          (&local_78,
                                           (v5 *)
                                           "ybase is only for rectangular meshes! Mesh type is \"{}\""
                                           ,(char (*) [56])&segment->meshtype,in_RCX);
                                tao::pegtl::parse_error::
                                parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                          (ppVar8,&local_78,in);
                                __cxa_throw(ppVar8,&tao::pegtl::parse_error::typeinfo,
                                            tao::pegtl::parse_error::~parse_error);
                              }
                              pcVar7 = strdup("rectangular");
                              segment->meshtype = pcVar7;
                              std::__cxx11::string::string
                                        ((string *)&local_78,(f->_state->value)._M_dataplus._M_p,
                                         (allocator *)local_58._M_local_buf);
                              fVar12 = std::__cxx11::stof(&local_78,(size_t *)0x0);
                              segment->origin[1] = fVar12;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                                operator_delete(local_78._M_dataplus._M_p);
                              }
                              f->_state->found_ybase = true;
                            }
                            else {
                              iVar5 = std::__cxx11::string::compare((char *)&f->_state->keyword);
                              if (iVar5 == 0) {
                                std::__cxx11::string::string
                                          ((string *)&local_78,segment->meshtype,
                                           (allocator *)local_58._M_local_buf);
                                iVar5 = std::__cxx11::string::compare((char *)&local_78);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_78._M_dataplus._M_p != &local_78.field_2) {
                                  operator_delete(local_78._M_dataplus._M_p);
                                }
                                if (iVar5 != 0) {
                                  ppVar8 = (parse_error *)__cxa_allocate_exception(0x28);
                                  fmt::v5::format<char[56],char*>
                                            (&local_78,
                                             (v5 *)
                                             "zbase is only for rectangular meshes! Mesh type is \"{}\""
                                             ,(char (*) [56])&segment->meshtype,in_RCX);
                                  tao::pegtl::parse_error::
                                  parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                            (ppVar8,&local_78,in);
                                  __cxa_throw(ppVar8,&tao::pegtl::parse_error::typeinfo,
                                              tao::pegtl::parse_error::~parse_error);
                                }
                                pcVar7 = strdup("rectangular");
                                segment->meshtype = pcVar7;
                                std::__cxx11::string::string
                                          ((string *)&local_78,(f->_state->value)._M_dataplus._M_p,
                                           (allocator *)local_58._M_local_buf);
                                fVar12 = std::__cxx11::stof(&local_78,(size_t *)0x0);
                                segment->origin[2] = fVar12;
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_78._M_dataplus._M_p != &local_78.field_2) {
                                  operator_delete(local_78._M_dataplus._M_p);
                                }
                                f->_state->found_zbase = true;
                              }
                              else {
                                iVar5 = std::__cxx11::string::compare((char *)&f->_state->keyword);
                                if (iVar5 == 0) {
                                  std::__cxx11::string::string
                                            ((string *)&local_78,segment->meshtype,
                                             (allocator *)local_58._M_local_buf);
                                  iVar5 = std::__cxx11::string::compare((char *)&local_78);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_78._M_dataplus._M_p != &local_78.field_2) {
                                    operator_delete(local_78._M_dataplus._M_p);
                                  }
                                  if (iVar5 != 0) {
                                    ppVar8 = (parse_error *)__cxa_allocate_exception(0x28);
                                    fmt::v5::format<char[60],char*>
                                              (&local_78,
                                               (v5 *)
                                               "xstepsize is only for rectangular meshes! Mesh type is \"{}\""
                                               ,(char (*) [60])&segment->meshtype,in_RCX);
                                    tao::pegtl::parse_error::
                                    parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                              (ppVar8,&local_78,in);
                                    __cxa_throw(ppVar8,&tao::pegtl::parse_error::typeinfo,
                                                tao::pegtl::parse_error::~parse_error);
                                  }
                                  pcVar7 = strdup("rectangular");
                                  segment->meshtype = pcVar7;
                                  std::__cxx11::string::string
                                            ((string *)&local_78,(f->_state->value)._M_dataplus._M_p
                                             ,(allocator *)local_58._M_local_buf);
                                  fVar12 = std::__cxx11::stof(&local_78,(size_t *)0x0);
                                  segment->step_size[0] = fVar12;
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_78._M_dataplus._M_p != &local_78.field_2) {
                                    operator_delete(local_78._M_dataplus._M_p);
                                  }
                                  f->_state->found_xstepsize = true;
                                }
                                else {
                                  iVar5 = std::__cxx11::string::compare((char *)&f->_state->keyword)
                                  ;
                                  if (iVar5 == 0) {
                                    std::__cxx11::string::string
                                              ((string *)&local_78,segment->meshtype,
                                               (allocator *)local_58._M_local_buf);
                                    iVar5 = std::__cxx11::string::compare((char *)&local_78);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_78._M_dataplus._M_p != &local_78.field_2) {
                                      operator_delete(local_78._M_dataplus._M_p);
                                    }
                                    if (iVar5 != 0) {
                                      ppVar8 = (parse_error *)__cxa_allocate_exception(0x28);
                                      fmt::v5::format<char[60],char*>
                                                (&local_78,
                                                 (v5 *)
                                                 "ystepsize is only for rectangular meshes! Mesh type is \"{}\""
                                                 ,(char (*) [60])&segment->meshtype,in_RCX);
                                      tao::pegtl::parse_error::
                                      parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                (ppVar8,&local_78,in);
                                      __cxa_throw(ppVar8,&tao::pegtl::parse_error::typeinfo,
                                                  tao::pegtl::parse_error::~parse_error);
                                    }
                                    pcVar7 = strdup("rectangular");
                                    segment->meshtype = pcVar7;
                                    std::__cxx11::string::string
                                              ((string *)&local_78,
                                               (f->_state->value)._M_dataplus._M_p,
                                               (allocator *)local_58._M_local_buf);
                                    fVar12 = std::__cxx11::stof(&local_78,(size_t *)0x0);
                                    segment->step_size[1] = fVar12;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_78._M_dataplus._M_p != &local_78.field_2) {
                                      operator_delete(local_78._M_dataplus._M_p);
                                    }
                                    f->_state->found_ystepsize = true;
                                  }
                                  else {
                                    iVar5 = std::__cxx11::string::compare
                                                      ((char *)&f->_state->keyword);
                                    if (iVar5 == 0) {
                                      std::__cxx11::string::string
                                                ((string *)&local_78,segment->meshtype,
                                                 (allocator *)local_58._M_local_buf);
                                      iVar5 = std::__cxx11::string::compare((char *)&local_78);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_78._M_dataplus._M_p != &local_78.field_2) {
                                        operator_delete(local_78._M_dataplus._M_p);
                                      }
                                      if (iVar5 != 0) {
                                        ppVar8 = (parse_error *)__cxa_allocate_exception(0x28);
                                        fmt::v5::format<char[60],char*>
                                                  (&local_78,
                                                   (v5 *)
                                                  "zstepsize is only for rectangular meshes! Mesh type is \"{}\""
                                                  ,(char (*) [60])&segment->meshtype,in_RCX);
                                        tao::pegtl::parse_error::
                                        parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                  (ppVar8,&local_78,in);
                                        __cxa_throw(ppVar8,&tao::pegtl::parse_error::typeinfo,
                                                    tao::pegtl::parse_error::~parse_error);
                                      }
                                      pcVar7 = strdup("rectangular");
                                      segment->meshtype = pcVar7;
                                      std::__cxx11::string::string
                                                ((string *)&local_78,
                                                 (f->_state->value)._M_dataplus._M_p,
                                                 (allocator *)local_58._M_local_buf);
                                      fVar12 = std::__cxx11::stof(&local_78,(size_t *)0x0);
                                      segment->step_size[2] = fVar12;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_78._M_dataplus._M_p != &local_78.field_2) {
                                        operator_delete(local_78._M_dataplus._M_p);
                                      }
                                      f->_state->found_zstepsize = true;
                                    }
                                    else {
                                      iVar5 = std::__cxx11::string::compare
                                                        ((char *)&f->_state->keyword);
                                      if (iVar5 == 0) {
                                        std::__cxx11::string::string
                                                  ((string *)&local_78,segment->meshtype,
                                                   (allocator *)local_58._M_local_buf);
                                        iVar5 = std::__cxx11::string::compare((char *)&local_78);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_78._M_dataplus._M_p != &local_78.field_2) {
                                          operator_delete(local_78._M_dataplus._M_p);
                                        }
                                        if (iVar5 != 0) {
                                          ppVar8 = (parse_error *)__cxa_allocate_exception(0x28);
                                          fmt::v5::format<char[57],char*>
                                                    (&local_78,
                                                     (v5 *)
                                                  "xnodes is only for rectangular meshes! Mesh type is \"{}\""
                                                  ,(char (*) [57])&segment->meshtype,in_RCX);
                                          tao::pegtl::parse_error::
                                          parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                    (ppVar8,&local_78,in);
                                          __cxa_throw(ppVar8,&tao::pegtl::parse_error::typeinfo,
                                                      tao::pegtl::parse_error::~parse_error);
                                        }
                                        pcVar7 = strdup("rectangular");
                                        segment->meshtype = pcVar7;
                                        std::__cxx11::string::string
                                                  ((string *)&local_78,
                                                   (f->_state->value)._M_dataplus._M_p,
                                                   (allocator *)local_58._M_local_buf);
                                        iVar5 = std::__cxx11::stoi(&local_78,(size_t *)0x0,10);
                                        segment->n_cells[0] = iVar5;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_78._M_dataplus._M_p != &local_78.field_2) {
                                          operator_delete(local_78._M_dataplus._M_p);
                                        }
                                        f->_state->found_xnodes = true;
                                      }
                                      else {
                                        iVar5 = std::__cxx11::string::compare
                                                          ((char *)&f->_state->keyword);
                                        if (iVar5 == 0) {
                                          std::__cxx11::string::string
                                                    ((string *)&local_78,segment->meshtype,
                                                     (allocator *)local_58._M_local_buf);
                                          iVar5 = std::__cxx11::string::compare((char *)&local_78);
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_78._M_dataplus._M_p != &local_78.field_2) {
                                            operator_delete(local_78._M_dataplus._M_p);
                                          }
                                          if (iVar5 != 0) {
                                            ppVar8 = (parse_error *)__cxa_allocate_exception(0x28);
                                            fmt::v5::format<char[57],char*>
                                                      (&local_78,
                                                       (v5 *)
                                                  "ynodes is only for rectangular meshes! Mesh type is \"{}\""
                                                  ,(char (*) [57])&segment->meshtype,in_RCX);
                                            tao::pegtl::parse_error::
                                            parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                      (ppVar8,&local_78,in);
                                            __cxa_throw(ppVar8,&tao::pegtl::parse_error::typeinfo,
                                                        tao::pegtl::parse_error::~parse_error);
                                          }
                                          pcVar7 = strdup("rectangular");
                                          segment->meshtype = pcVar7;
                                          std::__cxx11::string::string
                                                    ((string *)&local_78,
                                                     (f->_state->value)._M_dataplus._M_p,
                                                     (allocator *)local_58._M_local_buf);
                                          iVar5 = std::__cxx11::stoi(&local_78,(size_t *)0x0,10);
                                          segment->n_cells[1] = iVar5;
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_78._M_dataplus._M_p != &local_78.field_2) {
                                            operator_delete(local_78._M_dataplus._M_p);
                                          }
                                          f->_state->found_ynodes = true;
                                        }
                                        else {
                                          iVar5 = std::__cxx11::string::compare
                                                            ((char *)&f->_state->keyword);
                                          if (iVar5 == 0) {
                                            std::__cxx11::string::string
                                                      ((string *)&local_78,segment->meshtype,
                                                       (allocator *)local_58._M_local_buf);
                                            iVar5 = std::__cxx11::string::compare((char *)&local_78)
                                            ;
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
                                              operator_delete(local_78._M_dataplus._M_p);
                                            }
                                            if (iVar5 != 0) {
                                              ppVar8 = (parse_error *)__cxa_allocate_exception(0x28)
                                              ;
                                              fmt::v5::format<char[57],char*>
                                                        (&local_78,
                                                         (v5 *)
                                                  "znodes is only for rectangular meshes! Mesh type is \"{}\""
                                                  ,(char (*) [57])&segment->meshtype,in_RCX);
                                              tao::pegtl::parse_error::
                                              parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                        (ppVar8,&local_78,in);
                                              __cxa_throw(ppVar8,&tao::pegtl::parse_error::typeinfo,
                                                          tao::pegtl::parse_error::~parse_error);
                                            }
                                            pcVar7 = strdup("rectangular");
                                            segment->meshtype = pcVar7;
                                            std::__cxx11::string::string
                                                      ((string *)&local_78,
                                                       (f->_state->value)._M_dataplus._M_p,
                                                       (allocator *)local_58._M_local_buf);
                                            iVar5 = std::__cxx11::stoi(&local_78,(size_t *)0x0,10);
                                            segment->n_cells[2] = iVar5;
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
                                              operator_delete(local_78._M_dataplus._M_p);
                                            }
                                            f->_state->found_znodes = true;
                                          }
                                          else {
                                            iVar5 = std::__cxx11::string::compare
                                                              ((char *)&f->_state->keyword);
                                            if (iVar5 != 0) {
                                              ppVar8 = (parse_error *)__cxa_allocate_exception(0x28)
                                              ;
                                              fmt::v5::
                                              format<char[27],std::__cxx11::string,std::__cxx11::string>
                                                        (&local_78,
                                                         (v5 *)"unknown keyword \"{}\": \"{}\"",
                                                         (char (*) [27])&f->_state->keyword,
                                                         &f->_state->value,in_R8);
                                              tao::pegtl::parse_error::
                                              parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                        (ppVar8,&local_78,in);
                                              __cxa_throw(ppVar8,&tao::pegtl::parse_error::typeinfo,
                                                          tao::pegtl::parse_error::~parse_error);
                                            }
                                            std::__cxx11::string::string
                                                      ((string *)&local_78,segment->meshtype,
                                                       &local_79);
                                            ppcVar6 = &segment->meshtype;
                                            iVar5 = std::__cxx11::string::compare((char *)&local_78)
                                            ;
                                            if (iVar5 == 0) {
                                              bVar11 = false;
                                            }
                                            else {
                                              std::__cxx11::string::string
                                                        ((string *)local_58._M_local_buf,*ppcVar6,
                                                         &local_31);
                                              iVar5 = std::__cxx11::string::compare
                                                                (local_58._M_local_buf);
                                              bVar11 = iVar5 != 0;
                                              if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_58._M_allocated_capacity != &local_48) {
                                                operator_delete((void *)local_58.
                                                  _M_allocated_capacity);
                                              }
                                            }
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
                                              operator_delete(local_78._M_dataplus._M_p);
                                            }
                                            if (bVar11) {
                                              ppVar8 = (parse_error *)__cxa_allocate_exception(0x28)
                                              ;
                                              fmt::v5::format<char[59],char*>
                                                        (&local_78,
                                                         (v5 *)
                                                  "pointcount is only for irregular meshes! Mesh type is \"{}\""
                                                  ,(char (*) [59])ppcVar6,in_RCX);
                                              tao::pegtl::parse_error::
                                              parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                        (ppVar8,&local_78,in);
                                              __cxa_throw(ppVar8,&tao::pegtl::parse_error::typeinfo,
                                                          tao::pegtl::parse_error::~parse_error);
                                            }
                                            pcVar7 = strdup("irregular");
                                            *ppcVar6 = pcVar7;
                                            std::__cxx11::string::string
                                                      ((string *)&local_78,
                                                       (f->_state->value)._M_dataplus._M_p,&local_79
                                                      );
                                            iVar5 = std::__cxx11::stoi(&local_78,(size_t *)0x0,10);
                                            segment->pointcount = iVar5;
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
                                              operator_delete(local_78._M_dataplus._M_p);
                                            }
                                            f->_state->found_pointcount = true;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0014b9c5:
  std::__cxx11::string::_M_replace
            ((ulong)&f->_state->keyword,0,(char *)(f->_state->keyword)._M_string_length,0x155b1d);
  std::__cxx11::string::_M_replace
            ((ulong)&f->_state->value,0,(char *)(f->_state->value)._M_string_length,0x155b1d);
  return;
}

Assistant:

static void apply( const Input& in, ovf_file & f, ovf_segment & segment )
            {
                if( f._state->keyword == "title" )
                {
                    segment.title = strdup(f._state->value.c_str());
                    f._state->found_title = true;
                }
                else if( f._state->keyword == "desc" )
                    segment.comment = strdup(f._state->value.c_str());
                else if( f._state->keyword == "meshunit" )
                {
                    segment.meshunit = strdup(f._state->value.c_str());
                    f._state->found_meshunit = true;
                }
                else if( f._state->keyword == "valuedim" )
                {
                    segment.valuedim = std::stoi(f._state->value.c_str());
                    f._state->found_valuedim = true;
                }
                else if( f._state->keyword == "valueunits" )
                {
                    segment.valueunits = strdup(f._state->value.c_str());
                    f._state->found_valueunits = true;
                }
                else if( f._state->keyword == "valuelabels" )
                {
                    segment.valuelabels = strdup(f._state->value.c_str());
                    f._state->found_valuelabels = true;
                }
                else if( f._state->keyword == "xmin" )
                {
                    segment.bounds_min[0] = std::stof(f._state->value.c_str());
                    f._state->found_xmin = true;
                }
                else if( f._state->keyword == "ymin" )
                {
                    segment.bounds_min[1] = std::stof(f._state->value.c_str());
                    f._state->found_ymin = true;
                }
                else if( f._state->keyword == "zmin" )
                {
                    segment.bounds_min[2] = std::stof(f._state->value.c_str());
                    f._state->found_zmin = true;
                }
                else if( f._state->keyword == "xmax" )
                {
                    segment.bounds_max[0] = std::stof(f._state->value.c_str());
                    f._state->found_xmax = true;
                }
                else if( f._state->keyword == "ymax" )
                {
                    segment.bounds_max[1] = std::stof(f._state->value.c_str());
                    f._state->found_ymax = true;
                }
                else if( f._state->keyword == "zmax" )
                {
                    segment.bounds_max[2] = std::stof(f._state->value.c_str());
                    f._state->found_zmax = true;
                }
                else if( f._state->keyword == "meshtype" )
                {
                    std::string meshtype = f._state->value;
                    std::transform(meshtype.begin(), meshtype.end(), meshtype.begin(), ::tolower);
                    if( std::string(segment.meshtype) == "" )
                    {
                        if( meshtype != "rectangular" && meshtype != "irregular" )
                            throw tao::pegtl::parse_error( fmt::format(
                                "Invalid meshtype: \"{}\"", meshtype), in );
                        segment.meshtype = strdup(meshtype.c_str());
                    }
                    else if( std::string(segment.meshtype) != meshtype )
                    {
                        throw tao::pegtl::parse_error( fmt::format(
                            "meshtype \"{}\" was specified, but due to other parameters specified before, \"{}\" was expected!",
                            meshtype, segment.meshtype), in );
                    }
                    f._state->found_meshtype = true;
                }
                else if( f._state->keyword == "xbase" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "xbase is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.origin[0] = std::stof(f._state->value.c_str());
                    f._state->found_xbase = true;
                }
                else if( f._state->keyword == "ybase" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "ybase is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.origin[1] = std::stof(f._state->value.c_str());
                    f._state->found_ybase = true;
                }
                else if( f._state->keyword == "zbase" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "zbase is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.origin[2] = std::stof(f._state->value.c_str());
                    f._state->found_zbase = true;
                }
                else if( f._state->keyword == "xstepsize" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "xstepsize is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.step_size[0] = std::stof(f._state->value.c_str());
                    f._state->found_xstepsize = true;
                }
                else if( f._state->keyword == "ystepsize" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "ystepsize is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.step_size[1] = std::stof(f._state->value.c_str());
                    f._state->found_ystepsize = true;
                }
                else if( f._state->keyword == "zstepsize" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "zstepsize is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.step_size[2] = std::stof(f._state->value.c_str());
                    f._state->found_zstepsize = true;
                }
                else if( f._state->keyword == "xnodes" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "xnodes is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.n_cells[0] = std::stoi(f._state->value.c_str());
                    f._state->found_xnodes = true;
                }
                else if( f._state->keyword == "ynodes" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "ynodes is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.n_cells[1] = std::stoi(f._state->value.c_str());
                    f._state->found_ynodes = true;
                }
                else if( f._state->keyword == "znodes" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "znodes is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.n_cells[2] = std::stoi(f._state->value.c_str());
                    f._state->found_znodes = true;
                }
                else if( f._state->keyword == "pointcount" )
                {
                    if( std::string(segment.meshtype) != "" && std::string(segment.meshtype) != "irregular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "pointcount is only for irregular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("irregular");
                    segment.pointcount = std::stoi(f._state->value.c_str());
                    f._state->found_pointcount = true;
                }
                else
                {
                    // UNKNOWN KEYWORD
                    throw tao::pegtl::parse_error( fmt::format(
                        "unknown keyword \"{}\": \"{}\"", f._state->keyword, f._state->value), in );
                }

                f._state->keyword = "";
                f._state->value = "";
            }